

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

void __thiscall
ON_ClassArray<ON_UserString>::Append(ON_ClassArray<ON_UserString> *this,int count,ON_UserString *p)

{
  int iVar1;
  ON_UserString *pOVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  
  if (p != (ON_UserString *)0x0 && 0 < count) {
    iVar1 = this->m_count;
    uVar3 = iVar1 + count;
    if (this->m_capacity < (int)uVar3) {
      if (iVar1 < 8 || (ulong)((long)iVar1 << 4) < 0x10000001) {
        uVar5 = 4;
        if (2 < iVar1) {
          uVar5 = iVar1 * 2;
        }
      }
      else {
        iVar4 = 0x1000008;
        if (iVar1 < 0x1000008) {
          iVar4 = iVar1;
        }
        uVar5 = iVar4 + iVar1;
      }
      if ((int)uVar3 < (int)uVar5) {
        uVar3 = uVar5;
      }
      if ((uint)this->m_capacity < uVar3) {
        SetCapacity(this,(long)(int)uVar3);
      }
    }
    uVar6 = 1;
    if (1 < count) {
      uVar6 = (ulong)(uint)count;
    }
    do {
      pOVar2 = this->m_a;
      iVar1 = this->m_count;
      this->m_count = iVar1 + 1;
      ON_wString::operator=(&pOVar2[iVar1].m_key,&p->m_key);
      ON_wString::operator=(&pOVar2[iVar1].m_string_value,&p->m_string_value);
      p = p + 1;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  return;
}

Assistant:

void ON_ClassArray<T>::Append( int count, const T* p ) 
{
  int i;
  if ( count > 0 && p ) 
  {
    if ( count + m_count > m_capacity ) 
    {
      int newcapacity = NewCapacity();
      if ( newcapacity < count + m_count )
        newcapacity = count + m_count;
      Reserve( newcapacity );
    }
    for ( i = 0; i < count; i++ ) {
      m_a[m_count++] = p[i];
    }
  }
}